

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O2

void __thiscall QCommonStylePrivate::~QCommonStylePrivate(QCommonStylePrivate *this)

{
  QStyleOptionViewItem *this_00;
  
  *(undefined ***)&this->super_QStylePrivate = &PTR__QCommonStylePrivate_007c31d0;
  qDeleteAll<QHash<QObject_const*,QStyleAnimation*>>(&this->animations);
  this_00 = this->cachedOption;
  if (this_00 != (QStyleOptionViewItem *)0x0) {
    QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
  }
  operator_delete(this_00,0xd0);
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(&this->animations);
  QIcon::~QIcon(&this->tabBarcloseButtonIcon);
  QStylePrivate::~QStylePrivate(&this->super_QStylePrivate);
  return;
}

Assistant:

~QCommonStylePrivate()
    {
#if QT_CONFIG(animation)
        qDeleteAll(animations);
#endif
#if QT_CONFIG(itemviews)
        delete cachedOption;
#endif
    }